

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O1

void test_read_bits(uchar *buf,uchar **p,size_t *bit_offset,size_t *bits_available,
                   size_t bits_wanted)

{
  size_t *psVar1;
  ostream *poVar2;
  runtime_error *this;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  size_t *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((size_t *)*bit_offset < bits_available) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_90,(unsigned_long)bits_available);
    std::operator+(&local_70,"overflow reading bit stream: wanted = ",&local_90);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0.field_2._8_8_ = plVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar4;
    }
    local_d0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::to_string(&local_b0,*bit_offset);
    std::operator+(&local_50,&local_d0,&local_b0);
    std::runtime_error::runtime_error(this,(string *)&local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (bits_available != (size_t *)0x0) {
    lVar5 = *(long *)buf;
    do {
      psVar6 = (size_t *)(*p + 1);
      psVar1 = bits_available;
      if (psVar6 < bits_available) {
        psVar1 = psVar6;
      }
      if (bits_available < psVar6) {
        *p = (uchar *)((long)psVar6 + (-1 - (long)psVar1));
      }
      else {
        *p = (uchar *)0x7;
        lVar5 = lVar5 + 1;
        *(long *)buf = lVar5;
      }
      *bit_offset = *bit_offset - (long)psVar1;
      bits_available = (size_t *)((long)bits_available - (long)psVar1);
    } while (bits_available != (size_t *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bits read: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", result = ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  print_values(*(long *)buf + -0x2610b6,(size_t)*p,*bit_offset);
  return;
}

Assistant:

static void
test_read_bits(
    unsigned char const* buf,
    unsigned char const*& p,
    size_t& bit_offset,
    size_t& bits_available,
    size_t bits_wanted)
{
    unsigned long result = QIntC::to_ulong(read_bits(p, bit_offset, bits_available, bits_wanted));

    std::cout << "bits read: " << bits_wanted << ", result = " << result << std::endl;
    print_values(p - buf, bit_offset, bits_available);
}